

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pda.cpp
# Opt level: O1

void __thiscall Pda::addNode(Pda *this,string *name,bool start,bool end)

{
  pointer *pppNVar1;
  pointer pcVar2;
  iterator iVar3;
  Node *this_00;
  Node *n;
  Node *local_58;
  string local_50;
  
  this_00 = (Node *)operator_new(0x88);
  pcVar2 = (name->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + name->_M_string_length);
  Tjen::Node::Node(this_00,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  iVar3._M_current =
       (this->allNodes).super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_58 = this_00;
  if (iVar3._M_current ==
      (this->allNodes).super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Tjen::Node*,std::allocator<Tjen::Node*>>::_M_realloc_insert<Tjen::Node*const&>
              ((vector<Tjen::Node*,std::allocator<Tjen::Node*>> *)&this->allNodes,iVar3,&local_58);
  }
  else {
    *iVar3._M_current = this_00;
    pppNVar1 = &(this->allNodes).super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppNVar1 = *pppNVar1 + 1;
  }
  if (start) {
    this->start = local_58;
  }
  if (end) {
    iVar3._M_current =
         (this->endNodes).super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (this->endNodes).super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Tjen::Node*,std::allocator<Tjen::Node*>>::_M_realloc_insert<Tjen::Node*const&>
                ((vector<Tjen::Node*,std::allocator<Tjen::Node*>> *)&this->endNodes,iVar3,&local_58)
      ;
    }
    else {
      *iVar3._M_current = local_58;
      pppNVar1 = &(this->endNodes).super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppNVar1 = *pppNVar1 + 1;
    }
  }
  return;
}

Assistant:

void Pda::addNode(std::string name, bool start, bool end) {
    Tjen::Node * n = new Tjen::Node(name);
    this->allNodes.push_back(n);

    if(start){
        this->start = n;
    }
    if(end){
        this->endNodes.push_back(n);
    }
}